

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall
smf::Binasc::getWord(Binasc *this,string *word,string *input,string *terminators,int index)

{
  int iVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  
  bVar3 = false;
  std::__cxx11::string::resize((ulong)word);
  lVar5 = std::__cxx11::string::find((char)terminators,0x22);
  do {
    while( true ) {
      iVar1 = (int)input->_M_string_length;
      if (iVar1 <= index) {
        return index;
      }
      pcVar2 = (input->_M_dataplus)._M_p;
      if (lVar5 != -1) break;
LAB_0011d20a:
      lVar6 = std::__cxx11::string::find((char)terminators,(ulong)(uint)(int)pcVar2[index]);
      if (lVar6 != -1) {
        return index + 1;
      }
      std::__cxx11::string::push_back((char)word);
      index = index + 1;
    }
    bVar4 = bVar3;
    if (pcVar2[index] == '\"') {
      index = index + 1;
      bVar4 = true;
      if (bVar3) {
        return index;
      }
    }
    bVar3 = bVar4;
    if (((iVar1 + -1 <= index) || (pcVar2[index] != '\\')) || (pcVar2[(long)index + 1] != '\"'))
    goto LAB_0011d20a;
    std::__cxx11::string::push_back((char)word);
    index = index + 2;
  } while( true );
}

Assistant:

int Binasc::getWord(std::string& word, const std::string& input,
		const std::string& terminators, int index) {
	word.resize(0);
	int i = index;
	int escape = 0;
	int ecount = 0;
	if (terminators.find('"') != std::string::npos) {
		escape = 1;
	}
	while (i < (int)input.size()) {
		if (escape && input[i] == '\"') {
			ecount++;
			i++;
			if (ecount >= 2) {
				break;
			}
		}
		if (escape && (i<(int)input.size()-1) && (input[i] == '\\')
				&& (input[i+1] == '"')) {
			word.push_back(input[i+1]);
			i += 2;
		} else if (terminators.find(input[i]) == std::string::npos) {
			word.push_back(input[i]);
			i++;
		} else {
			i++;
			return i;
		}
	}
	return i;
}